

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O2

void __thiscall
pbrt::ProgressReporter::ProgressReporter
          (ProgressReporter *this,int64_t totalWork,string *title,bool quiet,bool gpu)

{
  int64_t iVar1;
  
  iVar1 = 1;
  if (1 < totalWork) {
    iVar1 = totalWork;
  }
  this->totalWork = iVar1;
  std::__cxx11::string::string((string *)&this->title,(string *)title);
  this->quiet = quiet;
  Timer::Timer(&this->timer);
  (this->updateThread)._M_id._M_thread = 0;
  LOCK();
  (this->workDone).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->exitThread)._M_base._M_i = false;
  UNLOCK();
  if (!gpu) {
    if (!quiet) {
      launchThread(this);
    }
    return;
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/progressreporter.cpp"
             ,0x39,"Check failed: %s",(char (*) [13])"gpu == false");
}

Assistant:

ProgressReporter::ProgressReporter(int64_t totalWork, const std::string &title,
                                   bool quiet, bool gpu)
    : totalWork(std::max<int64_t>(1, totalWork)), title(title), quiet(quiet) {
    workDone = 0;
    exitThread = false;

#ifdef PBRT_BUILD_GPU_RENDERER
    if (gpu) {
        gpuEventsLaunchedOffset = 0;
        gpuEventsFinishedOffset = 0;

        gpuEvents.resize(totalWork);
        for (cudaEvent_t &event : gpuEvents)
            CUDA_CHECK(cudaEventCreate(&event));
    }
#else
    CHECK(gpu == false);
#endif

    // Launch thread to periodically update progress bar
    if (!quiet)
        launchThread();
}